

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::FunctionBreakpoint>::destruct
          (BasicTypeInfo<dap::FunctionBreakpoint> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::FunctionBreakpoint> *this_local;
  
  FunctionBreakpoint::~FunctionBreakpoint((FunctionBreakpoint *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }